

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yacclab_tests.cc
# Opt level: O2

void __thiscall YacclabTests::CheckDatasets(YacclabTests *this)

{
  bool bVar1;
  ModeConfig *pMVar2;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  byte bVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ds;
  CheckDatasetsExistence check_datasets_existence;
  allocator local_8a;
  allocator local_89;
  string local_88;
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  CheckDatasetsExistence local_28;
  
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pMVar2 = this->mode_cfg_;
  if (pMVar2->perform_correctness == true) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
               (const_iterator)0x0,
               (pMVar2->check_datasets).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (pMVar2->check_datasets).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    pMVar2 = this->mode_cfg_;
  }
  if (pMVar2->perform_memory == true) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
               (const_iterator)
               local_48.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (pMVar2->memory_datasets).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (pMVar2->memory_datasets).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    pMVar2 = this->mode_cfg_;
  }
  bVar3 = pMVar2->perform_average;
  if ((bool)bVar3 == true) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
               (const_iterator)
               local_48.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (pMVar2->average_datasets).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (pMVar2->average_datasets).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    pMVar2 = this->mode_cfg_;
    bVar3 = pMVar2->perform_average;
  }
  if ((bVar3 & 1) != 0) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
               (const_iterator)
               local_48.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (pMVar2->average_ws_datasets).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (pMVar2->average_ws_datasets).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    pMVar2 = this->mode_cfg_;
  }
  if (pMVar2->perform_blocksize == true) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
               (const_iterator)
               local_48.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (pMVar2->blocksize_datasets).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (pMVar2->blocksize_datasets).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (local_48.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             local_48.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  __first = std::
            __unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                      (local_48.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       local_48.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::erase(&local_48,(const_iterator)__first._M_current,
          (const_iterator)
          local_48.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish);
  local_28.ec_ = this->ec_;
  local_28.input_txt_ = &this->glob_cfg_->input_txt;
  local_28.input_path_ = &((GlobalConfig *)local_28.input_txt_)->input_path;
  pMVar2 = this->mode_cfg_;
  local_28.ob_ = &this->ob_;
  if (pMVar2->perform_correctness == true) {
    bVar1 = CheckDatasetsExistence::operator()(&local_28,&pMVar2->check_datasets,false);
    if (bVar1) {
      pMVar2 = this->mode_cfg_;
    }
    else {
      std::__cxx11::string::string
                ((string *)&local_68,"There are no valid datasets for \'correctness test\', skipped"
                 ,&local_89);
      std::__cxx11::string::string((string *)&local_88,"",&local_8a);
      OutputBox::Cwarning(&this->ob_,&local_68,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_68);
      pMVar2 = this->mode_cfg_;
      pMVar2->perform_correctness = false;
    }
  }
  if (pMVar2->perform_average == true) {
    bVar1 = CheckDatasetsExistence::operator()(&local_28,&pMVar2->average_datasets,false);
    if (bVar1) {
      pMVar2 = this->mode_cfg_;
    }
    else {
      std::__cxx11::string::string
                ((string *)&local_68,"There are no valid datasets for \'average test\', skipped",
                 &local_89);
      std::__cxx11::string::string((string *)&local_88,"",&local_8a);
      OutputBox::Cwarning(&this->ob_,&local_68,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_68);
      pMVar2 = this->mode_cfg_;
      pMVar2->perform_average = false;
    }
  }
  if (pMVar2->perform_average_ws == true) {
    bVar1 = CheckDatasetsExistence::operator()(&local_28,&pMVar2->average_ws_datasets,false);
    if (bVar1) {
      pMVar2 = this->mode_cfg_;
    }
    else {
      std::__cxx11::string::string
                ((string *)&local_68,
                 "There are no valid datasets for \'average with steps test\', skipped",&local_89);
      std::__cxx11::string::string((string *)&local_88,"",&local_8a);
      OutputBox::Cwarning(&this->ob_,&local_68,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_68);
      pMVar2 = this->mode_cfg_;
      pMVar2->perform_average_ws = false;
    }
  }
  if (pMVar2->perform_memory == true) {
    bVar1 = CheckDatasetsExistence::operator()(&local_28,&pMVar2->memory_datasets,false);
    if (bVar1) {
      pMVar2 = this->mode_cfg_;
    }
    else {
      std::__cxx11::string::string
                ((string *)&local_68,"There are no valid datasets for \'memory test\', skipped",
                 &local_89);
      std::__cxx11::string::string((string *)&local_88,"",&local_8a);
      OutputBox::Cwarning(&this->ob_,&local_68,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_68);
      pMVar2 = this->mode_cfg_;
      pMVar2->perform_memory = false;
    }
  }
  if (pMVar2->perform_blocksize == true) {
    bVar1 = CheckDatasetsExistence::operator()(&local_28,&pMVar2->blocksize_datasets,false);
    if (!bVar1) {
      std::__cxx11::string::string
                ((string *)&local_68,"There are no valid datasets for \'blocksize test\', skipped",
                 &local_89);
      std::__cxx11::string::string((string *)&local_88,"",&local_8a);
      OutputBox::Cwarning(&this->ob_,&local_68,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_68);
      this->mode_cfg_->perform_blocksize = false;
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void YacclabTests::CheckDatasets() {

    std::vector<std::string> ds;
    if (mode_cfg_.perform_correctness) {
        ds.insert(ds.end(), mode_cfg_.check_datasets.begin(), mode_cfg_.check_datasets.end());
    }
    if (mode_cfg_.perform_memory) {
        ds.insert(ds.end(), mode_cfg_.memory_datasets.begin(), mode_cfg_.memory_datasets.end());
    }
    if (mode_cfg_.perform_average) {
        ds.insert(ds.end(), mode_cfg_.average_datasets.begin(), mode_cfg_.average_datasets.end());
    }
    if (mode_cfg_.perform_average) {
        ds.insert(ds.end(), mode_cfg_.average_ws_datasets.begin(), mode_cfg_.average_ws_datasets.end());
    }
    if (mode_cfg_.perform_blocksize) {
        ds.insert(ds.end(), mode_cfg_.blocksize_datasets.begin(), mode_cfg_.blocksize_datasets.end());
    }
    std::sort(ds.begin(), ds.end());
    ds.erase(unique(ds.begin(), ds.end()), ds.end());
    CheckDatasetsExistence check_datasets_existence = CheckDatasetsExistence(glob_cfg_.input_path, glob_cfg_.input_txt, ob_, ec_); // To check single dataset

    if (mode_cfg_.perform_correctness) {
        if (!check_datasets_existence(mode_cfg_.check_datasets, false)) {
            ob_.Cwarning("There are no valid datasets for 'correctness test', skipped");
            mode_cfg_.perform_correctness = false;
        }
    }

    if (mode_cfg_.perform_average) {
        if (!check_datasets_existence(mode_cfg_.average_datasets, false)) {
            ob_.Cwarning("There are no valid datasets for 'average test', skipped");
            mode_cfg_.perform_average = false;
        }
    }

    if (mode_cfg_.perform_average_ws) {
        if (!check_datasets_existence(mode_cfg_.average_ws_datasets, false)) {
            ob_.Cwarning("There are no valid datasets for 'average with steps test', skipped");
            mode_cfg_.perform_average_ws = false;
        }
    }

    if (mode_cfg_.perform_memory) {
        if (!check_datasets_existence(mode_cfg_.memory_datasets, false)) {
            ob_.Cwarning("There are no valid datasets for 'memory test', skipped");
            mode_cfg_.perform_memory = false;
        }
    }

    if (mode_cfg_.perform_blocksize) {
        if (!check_datasets_existence(mode_cfg_.blocksize_datasets, false)) {
            ob_.Cwarning("There are no valid datasets for 'blocksize test', skipped");
            mode_cfg_.perform_blocksize = false;
        }
    }

}